

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

bool __thiscall psy::C::TypeChecker::isAssignable(TypeChecker *this,SyntaxNode *node,Type *ty)

{
  TypeKind TVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TagDeclarationSymbol *this_00;
  undefined4 extraout_var_01;
  SyntaxToken *this_01;
  MemberDeclarationSymbol **membDecl;
  bool bVar4;
  _Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  local_b0;
  SyntaxToken local_98;
  SyntaxToken local_60;
  
  do {
    TVar1 = Type::kind(ty);
    switch(TVar1) {
    case Array:
      C::SyntaxNode::lastToken(&local_98,node);
      DiagnosticsReporter::CannotAssignToExpressionOfArrayType(&this->diagReporter_,&local_98);
      this_01 = &local_98;
LAB_0030b2c4:
      SyntaxToken::~SyntaxToken(this_01);
      return false;
    default:
      return true;
    case TypedefName:
      iVar3 = (*ty->_vptr_Type[0xb])(ty);
      ty = TypedefNameType::resolvedSynonymizedType((TypedefNameType *)CONCAT44(extraout_var,iVar3))
      ;
      break;
    case Tag:
      iVar3 = (*ty->_vptr_Type[0xd])(ty);
      this_00 = TagType::declaration((TagType *)CONCAT44(extraout_var_00,iVar3));
      if (this_00 == (TagDeclarationSymbol *)0x0) {
        return false;
      }
      TagDeclarationSymbol::members((Members *)&local_b0,this_00);
      goto LAB_0030b242;
    case Qualified:
      C::SyntaxNode::lastToken(&local_60,node);
      DiagnosticsReporter::CannotAssignToExpressionOfConstQualifiedType
                (&this->diagReporter_,&local_60);
      this_01 = &local_60;
      goto LAB_0030b2c4;
    }
  } while( true );
  while( true ) {
    iVar3 = (*((*local_b0._M_impl.super__Vector_impl_data._M_start)->super_DeclarationSymbol).
              super_Symbol._vptr_Symbol[0x26])();
    bVar2 = isAssignable(this,node,(Type *)CONCAT44(extraout_var_01,iVar3));
    local_b0._M_impl.super__Vector_impl_data._M_start =
         local_b0._M_impl.super__Vector_impl_data._M_start + 1;
    if (!bVar2) break;
LAB_0030b242:
    bVar4 = local_b0._M_impl.super__Vector_impl_data._M_start ==
            local_b0._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) break;
  }
  std::
  _Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  ::~_Vector_base(&local_b0);
  return bVar4;
}

Assistant:

bool TypeChecker::isAssignable(const SyntaxNode* node, const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Qualified:
            diagReporter_.CannotAssignToExpressionOfConstQualifiedType(node->lastToken());
            return false;
        case TypeKind::TypedefName:
            return isAssignable(node, ty->asTypedefNameType()->resolvedSynonymizedType());
        case TypeKind::Array:
            diagReporter_.CannotAssignToExpressionOfArrayType(node->lastToken());
            return false;
        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            auto tagTyDecl = tagTy->declaration();
            if (!tagTyDecl)
                return false;
            for (const auto& membDecl : tagTyDecl->members()) {
                auto membTy = membDecl->type();
                if (!isAssignable(node, membTy))
                    return false;
            }
            return true;
        }
        default:
            return true;
    }
}